

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sx1231_somfy.c
# Opt level: O2

int dehexify(char *in,size_t bytes,uchar *out)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  uint uVar5;
  ulong uVar6;
  
  sVar4 = strlen(in);
  iVar2 = -1;
  if (bytes * 2 <= sVar4) {
    memset(out,0,bytes);
    for (uVar6 = 0; bytes != uVar6; uVar6 = uVar6 + 1) {
      iVar2 = (int)in[uVar6 * 2];
      uVar5 = iVar2 - 0x37;
      if (iVar2 < 0x3a) {
        uVar5 = iVar2 - 0x30;
      }
      uVar3 = uVar5 - 0x20;
      if ((int)uVar5 < 0x10) {
        uVar3 = uVar5;
      }
      if (0xf < uVar3) {
        return -1;
      }
      bVar1 = (char)uVar3 << 4;
      out[uVar6] = bVar1;
      iVar2 = (int)in[uVar6 * 2 + 1];
      uVar5 = iVar2 - 0x37;
      if (iVar2 < 0x3a) {
        uVar5 = iVar2 - 0x30;
      }
      uVar3 = uVar5 - 0x20;
      if ((int)uVar5 < 0x10) {
        uVar3 = uVar5;
      }
      if (0xf < uVar3) {
        return -1;
      }
      bVar1 = bVar1 | (byte)uVar3;
      out[uVar6] = bVar1;
      printf("%d - %x\n",uVar6 & 0xffffffff,(ulong)bVar1);
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int dehexify(char *in, size_t bytes, unsigned char *out)
{
	int i;
	int x;

	if (strlen(in) < bytes*2) {
		return -1;
	}

	memset(out, 0, bytes);
	for (i=0; i<bytes; i++) {
		x = dehex_nibble(in[(i*2)]);
		if (x < 0 || x > 15)
			return -1;
		out[i] = (x << 4);

		x = dehex_nibble(in[(i*2)+1]);
		if (x < 0 || x > 15)
			return -1;
		out[i] |= x;

		printf("%d - %x\n", i, out[i]);
	}

	return 0;
}